

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AssertionExpr.cpp
# Opt level: O2

NondegeneracyCheckResult * __thiscall
slang::ast::SequenceConcatExpr::checkNondegeneracyImpl
          (NondegeneracyCheckResult *__return_storage_ptr__,SequenceConcatExpr *this)

{
  uint32_t uVar1;
  SyntaxNode *this_00;
  SyntaxNode *this_01;
  pointer pEVar2;
  underlying_type uVar3;
  undefined1 uVar4;
  uint uVar5;
  SourceLocation SVar6;
  pointer pEVar7;
  uint uVar8;
  byte bVar9;
  bool bVar10;
  SourceRange SVar11;
  Token local_80;
  NondegeneracyCheckResult rightNondegen;
  NondegeneracyCheckResult leftNondegen;
  
  (__return_storage_ptr__->status).m_bits = 0;
  (__return_storage_ptr__->noMatchRange).startLoc = (SourceLocation)0x0;
  (__return_storage_ptr__->noMatchRange).endLoc = (SourceLocation)0x0;
  __return_storage_ptr__->isAlwaysFalse = false;
  pEVar7 = (this->elements)._M_ptr;
  AssertionExpr::checkNondegeneracy(&leftNondegen,(pEVar7->sequence).ptr);
  uVar1 = (pEVar7->delay).min;
  bVar10 = (leftNondegen.status.m_bits & 4) != 0;
  if (bVar10) {
    (__return_storage_ptr__->noMatchRange).startLoc = leftNondegen.noMatchRange.startLoc;
    (__return_storage_ptr__->noMatchRange).endLoc = leftNondegen.noMatchRange.endLoc;
  }
  else {
    leftNondegen.isAlwaysFalse = false;
  }
  bVar9 = uVar1 == 0 & (byte)leftNondegen.status.m_bits;
  uVar4 = leftNondegen.isAlwaysFalse;
LAB_003b8f77:
  pEVar2 = pEVar7;
  uVar8 = leftNondegen.status.m_bits;
  pEVar7 = pEVar2 + 1;
  if ((~bVar10 & 1U) == 0 && bVar9 == 0) {
    __return_storage_ptr__->isAlwaysFalse = (bool)uVar4;
LAB_003b90c0:
    uVar3 = 4;
  }
  else {
    if (pEVar7 != (this->elements)._M_ptr + (this->elements)._M_extent._M_extent_value) {
      AssertionExpr::checkNondegeneracy(&rightNondegen,pEVar2[1].sequence.ptr);
      leftNondegen.status = rightNondegen.status;
      if ((rightNondegen.status.m_bits & 4) != 0) {
        (__return_storage_ptr__->noMatchRange).startLoc = rightNondegen.noMatchRange.startLoc;
        (__return_storage_ptr__->noMatchRange).endLoc = rightNondegen.noMatchRange.endLoc;
        bVar10 = true;
        uVar4 = rightNondegen.isAlwaysFalse;
      }
      bVar9 = bVar9 & (byte)rightNondegen.status.m_bits;
      uVar5 = (pEVar7->delay).min;
      if (uVar5 == 0) goto code_r0x003b8fda;
      goto LAB_003b907e;
    }
    __return_storage_ptr__->isAlwaysFalse = (bool)uVar4;
    if (bVar9 == 0) goto LAB_003b90c0;
    (__return_storage_ptr__->status).m_bits = 1;
    uVar3 = 5;
  }
  if (bVar10 != false) {
    (__return_storage_ptr__->status).m_bits = uVar3;
  }
  return __return_storage_ptr__;
code_r0x003b8fda:
  if ((pEVar2[1].delay.max.super__Optional_base<unsigned_int,_true,_true>._M_payload.
       super__Optional_payload_base<unsigned_int>._M_engaged == true) &&
     (pEVar2[1].delay.max.super__Optional_base<unsigned_int,_true,_true>._M_payload.
      super__Optional_payload_base<unsigned_int>._M_payload._M_value == 0)) {
    if (((pEVar2 == (this->elements)._M_ptr) &&
        ((byte)((byte)((uVar8 & 2) >> 1) & (bVar10 ^ 1U)) != 0)) ||
       (uVar5 = 0, !(bool)((rightNondegen.status.m_bits & 2) == 0 | bVar10))) {
      this_00 = ((pEVar2->sequence).ptr)->syntax;
      this_01 = (pEVar2[1].sequence.ptr)->syntax;
      bVar10 = true;
      uVar5 = 0;
      if (this_01 != (SyntaxNode *)0x0 && this_00 != (SyntaxNode *)0x0) {
        local_80 = slang::syntax::SyntaxNode::getFirstToken(this_00);
        SVar6 = parsing::Token::location(&local_80);
        SVar11 = slang::syntax::SyntaxNode::sourceRange(this_01);
        (__return_storage_ptr__->noMatchRange).startLoc = SVar6;
        (__return_storage_ptr__->noMatchRange).endLoc = SVar11.endLoc;
        uVar5 = (pEVar7->delay).min;
        uVar4 = 0;
      }
    }
    bVar9 = 0;
LAB_003b907e:
    bVar9 = uVar5 < 2 & bVar9;
  }
  goto LAB_003b8f77;
}

Assistant:

static void enforceNondegeneracy(const AssertionExpr& expr, const ASTContext& context,
                                 AssertionExpr::NondegeneracyRequirement nondegRequirement,
                                 const SyntaxNode& syntax) {
    using NR = AssertionExpr::NondegeneracyRequirement;
    const auto seqNondegen = expr.checkNondegeneracy();
    const auto seqNondegenSt = seqNondegen.status;
    if (seqNondegenSt.has(NondegeneracyStatus::AdmitsNoMatch)) {
        auto range = seqNondegen.noMatchRange;
        if (!range.start())
            range = syntax.sourceRange();

        if (seqNondegen.isAlwaysFalse) {
            auto& diag = context.addDiag(diag::SeqNoMatch, syntax.sourceRange());
            diag.addNote(diag::NoteAlwaysFalse, range);
        }
        else {
            context.addDiag(diag::SeqNoMatch, range);
        }
    }
    else if (nondegRequirement == NR::OverlapOp) {
        if (seqNondegenSt.has(NondegeneracyStatus::AcceptsOnlyEmpty))
            context.addDiag(diag::SeqOnlyEmpty, syntax.sourceRange());
    }
    else if (nondegRequirement != NR::NonOverlapOp) {
        if (seqNondegenSt.has(NondegeneracyStatus::AdmitsEmpty))
            context.addDiag(diag::SeqEmptyMatch, syntax.sourceRange());
    }
}